

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O2

const_iterator __thiscall VarnodeBank::beginLoc(VarnodeBank *this,int4 s,Address *addr,uint4 fl)

{
  const_iterator cVar1;
  key_type local_b0;
  SeqNum sq;
  PcodeOp searchop;
  
  if (fl == 0x10) {
    SeqNum::SeqNum(&sq,m_minimal);
    PcodeOp::PcodeOp(&searchop,0,&sq);
    local_b0 = &this->searchvn;
    (this->searchvn).size = s;
    (this->searchvn).loc.base = addr->base;
    (this->searchvn).loc.offset = addr->offset;
    (this->searchvn).flags = 0x10;
    (this->searchvn).def = &searchop;
    cVar1 = std::
            _Rb_tree<Varnode_*,_Varnode_*,_std::_Identity<Varnode_*>,_VarnodeCompareLocDef,_std::allocator<Varnode_*>_>
            ::lower_bound(&(this->loc_tree)._M_t,&local_b0);
  }
  else {
    if (fl == 8) {
      searchop.opcode = (TypeOp *)&this->searchvn;
      (this->searchvn).size = s;
      (this->searchvn).loc.base = addr->base;
      (this->searchvn).loc.offset = addr->offset;
      cVar1 = std::
              _Rb_tree<Varnode_*,_Varnode_*,_std::_Identity<Varnode_*>,_VarnodeCompareLocDef,_std::allocator<Varnode_*>_>
              ::lower_bound(&(this->loc_tree)._M_t,(key_type *)&searchop);
      (this->searchvn).size = 0;
      return (const_iterator)cVar1._M_node;
    }
    SeqNum::SeqNum(&sq,m_maximal);
    PcodeOp::PcodeOp(&searchop,0,&sq);
    local_b0 = &this->searchvn;
    (this->searchvn).size = s;
    (this->searchvn).loc.base = addr->base;
    (this->searchvn).loc.offset = addr->offset;
    (this->searchvn).flags = 0x10;
    (this->searchvn).def = &searchop;
    cVar1 = std::
            _Rb_tree<Varnode_*,_Varnode_*,_std::_Identity<Varnode_*>,_VarnodeCompareLocDef,_std::allocator<Varnode_*>_>
            ::upper_bound(&(this->loc_tree)._M_t,&local_b0);
  }
  (this->searchvn).flags = 8;
  (this->searchvn).size = 0;
  std::_Vector_base<Varnode_*,_std::allocator<Varnode_*>_>::~_Vector_base
            (&searchop.inrefs.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>);
  return (const_iterator)cVar1._M_node;
}

Assistant:

VarnodeLocSet::const_iterator VarnodeBank::beginLoc(int4 s,const Address &addr,
						    uint4 fl) const
{
  VarnodeLocSet::const_iterator iter;

  if (fl == Varnode::input) {
    searchvn.size = s;
    searchvn.loc = addr;
    iter = loc_tree.lower_bound(&searchvn);
    searchvn.size = 0;
    return iter;
  }
  if (fl == Varnode::written) {
    SeqNum sq(Address::m_minimal); // Minimal sequence number
    PcodeOp searchop(0,sq);
    searchvn.size = s;
    searchvn.loc = addr;
    searchvn.flags = Varnode::written;
    searchvn.def = &searchop;
    iter = loc_tree.lower_bound(&searchvn);
    searchvn.size = 0;
    searchvn.flags = Varnode::input;
    return iter;
  }

  SeqNum sq(Address::m_maximal); // Maximal sequence number
  PcodeOp searchop(0,sq);
  searchvn.size = s;
  searchvn.loc = addr;
  searchvn.flags = Varnode::written;
  searchvn.def = &searchop;
  iter = loc_tree.upper_bound(&searchvn);
  searchvn.size = 0;
  searchvn.flags = Varnode::input;

  return iter;
}